

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# op_helper.c
# Opt level: O2

void helper_bisr(CPUTriCoreState *env,uint32_t const9)

{
  uint uVar1;
  uint32_t uVar2;
  uintptr_t in_RCX;
  uint uVar3;
  uint32_t unaff_retaddr;
  
  uVar1 = env->FCX;
  if (uVar1 == 0) {
    uVar2 = 4;
  }
  else {
    uVar3 = (uVar1 & 0xffff) << 6 | (uVar1 & 0xf0000) << 0xc;
    uVar2 = cpu_ldl_data_tricore(env,uVar3);
    save_context_lower(env,uVar3);
    uVar3 = env->ICR;
    in_RCX = 0xfffff;
    env->PCXI = env->FCX & 0xfffff | (uVar3 & 0x100) << 0xf | uVar3 << 0x18 | env->PCXI & 0x300000;
    env->FCX = uVar2 & 0xfffff | env->FCX & 0xfff00000;
    env->ICR = const9 | uVar3 | 0x100;
    if (uVar1 != env->LCX) {
      return;
    }
    uVar2 = 1;
  }
  raise_exception_sync_helper(env,uVar2,unaff_retaddr,in_RCX);
}

Assistant:

void helper_bisr(CPUTriCoreState *env, uint32_t const9)
{
    target_ulong tmp_FCX;
    target_ulong ea;
    target_ulong new_FCX;

    if (env->FCX == 0) {
        /* FCU trap */
       raise_exception_sync_helper(env, TRAPC_CTX_MNG, TIN3_FCU, GETPC());
    }

    tmp_FCX = env->FCX;
    ea = ((env->FCX & 0xf0000) << 12) + ((env->FCX & 0xffff) << 6);

    /* new_FCX = M(EA, word); */
    new_FCX = cpu_ldl_data(env, ea);
    /* M(EA, 16 * word) = {PCXI, A[11], A[2], A[3], D[0], D[1], D[2], D[3], A[4]
                           , A[5], A[6], A[7], D[4], D[5], D[6], D[7]}; */
    save_context_lower(env, ea);


    /* PCXI.PCPN = ICR.CCPN */
    env->PCXI = (env->PCXI & 0xffffff) +
                 ((env->ICR & MASK_ICR_CCPN) << 24);
    /* PCXI.PIE  = ICR.IE */
    env->PCXI = ((env->PCXI & ~MASK_PCXI_PIE_1_3) +
                 ((env->ICR & MASK_ICR_IE_1_3) << 15));
    /* PCXI.UL = 0 */
    env->PCXI &= ~(MASK_PCXI_UL);
    /* PCXI[19: 0] = FCX[19: 0] */
    env->PCXI = (env->PCXI & 0xfff00000) + (env->FCX & 0xfffff);
    /* FXC[19: 0] = new_FCX[19: 0] */
    env->FCX = (env->FCX & 0xfff00000) + (new_FCX & 0xfffff);
    /* ICR.IE = 1 */
    env->ICR |= MASK_ICR_IE_1_3;

    env->ICR |= const9; /* ICR.CCPN = const9[7: 0];*/

    if (tmp_FCX == env->LCX) {
        /* FCD trap */
        raise_exception_sync_helper(env, TRAPC_CTX_MNG, TIN3_FCD, GETPC());
    }
}